

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall asl::Console::bgcolor(Console *this,int r,int g,int b)

{
  char *pcVar1;
  char *pcVar2;
  String local_60;
  String local_38;
  int local_1c;
  int local_18;
  int b_local;
  int g_local;
  int r_local;
  Console *this_local;
  
  local_1c = b;
  local_18 = g;
  b_local = r;
  _g_local = this;
  bg(&local_38,this);
  pcVar1 = asl::String::operator*(&local_38);
  rgb(&local_60,this,b_local,local_18,local_1c);
  pcVar2 = asl::String::operator*(&local_60);
  printf("%s%s",pcVar1,pcVar2);
  asl::String::~String(&local_60);
  asl::String::~String(&local_38);
  return;
}

Assistant:

void Console::bgcolor(int r, int g, int b)
{
	printf("%s%s", *bg(), *rgb(r, g, b));
}